

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flush.c
# Opt level: O0

int mpt_stream_flush(mpt_stream *stream)

{
  void *__addr;
  size_t sVar1;
  uint uVar2;
  int __fd;
  void *pvVar3;
  int __count;
  undefined1 local_68 [8];
  iovec io [2];
  void *local_40;
  size_t low;
  size_t off;
  uint8_t *base;
  void *pvStack_20;
  int file;
  size_t len;
  mpt_stream *stream_local;
  
  local_40 = (void *)(stream->_wd)._state.done;
  if (local_40 == (void *)0x0) {
    return (uint)((stream->_wd).data.len != 0);
  }
  uVar2 = mpt_stream_flags(&stream->_info);
  pvStack_20 = local_40;
  if (((uVar2 & 0x80) == 0) || ((uVar2 & 0x10) != 0)) {
    __fd = _mpt_stream_fwrite(&stream->_info);
    if (-1 < __fd) {
      local_68 = (undefined1  [8])mpt_queue_data(&stream->_wd,io);
      if (local_68 == (undefined1  [8])0x0) {
        return -2;
      }
      if (io[0].iov_base < local_40) {
        io[0].iov_len = (size_t)(stream->_wd).data.base;
        io[1].iov_base = (void *)((long)local_40 - (long)io[0].iov_base);
        pvStack_20 = io[1].iov_base;
      }
      else {
        pvStack_20 = (void *)0x0;
        io[0].iov_base = local_40;
      }
      __count = 1;
      if (pvStack_20 != (void *)0x0) {
        __count = 2;
      }
      pvStack_20 = (void *)writev(__fd,(iovec *)local_68,__count);
      if (pvStack_20 == (void *)0x0) {
        mpt_stream_seterror(&stream->_info,2);
        return 1;
      }
    }
  }
  else {
    __addr = (stream->_wd).data.base;
    sVar1 = (stream->_wd).data.off;
    pvVar3 = (void *)((stream->_wd).data.max - sVar1);
    if (pvVar3 < local_40) {
      msync(__addr,(long)local_40 - (long)pvVar3,1);
      local_40 = pvVar3;
    }
    msync((void *)((long)__addr + sVar1),(size_t)local_40,1);
  }
  mpt_queue_crop(&stream->_wd,0,pvStack_20);
  (stream->_wd)._state.done = (stream->_wd)._state.done - (long)pvStack_20;
  return (uint)((stream->_wd).data.len != 0);
}

Assistant:

extern int mpt_stream_flush(MPT_STRUCT(stream) *stream)
{
	size_t len;
	int file;
	
	/* write data */
	len = stream->_wd._state.done;
	if (!len) {
		return stream->_wd.data.len ? 1 : 0;
	}
	file = mpt_stream_flags(&stream->_info);
	
	/* update memory mapped file */
	if ((file & MPT_STREAMFLAG(WriteMap))
	    && !(file & MPT_STREAMFLAG(ReadBuf))) {
		uint8_t *base = stream->_wd.data.base;
		size_t off, low;
		
		off = stream->_wd.data.off;
		low = stream->_wd.data.max - off;
		if (len > low) {
			msync(base, len - low, MS_ASYNC);
		} else {
			low = len;
		}
		msync(base + off, low, MS_ASYNC);
	}
	/* try to save ready data to backing file */
	else if ((file = _mpt_stream_fwrite(&stream->_info)) >= 0) {
		struct iovec io[2];
		/* get used parts */
		if (!(io[0].iov_base = mpt_queue_data(&stream->_wd.data, &io[0].iov_len))) {
			return -2;
		}
		/* prepare upper data part */
		if (len > io[0].iov_len) {
			io[1].iov_base = stream->_wd.data.base;
			io[1].iov_len  = len = len - io[0].iov_len;
		} else {
			io[0].iov_len = len;
			len = 0;
		}
		/* write queue buffer data to file */
		if ((len = writev(file, io, len ? 2 : 1)) <= 0) {
			if (!len) {
				mpt_stream_seterror(&stream->_info, MPT_ENUM(ErrorFull));
				return 1;
			} else {
				mpt_stream_seterror(&stream->_info, MPT_ENUM(ErrorWrite));
			}
			return len;
		}
	}
	/* remove written data from queue */
	mpt_queue_crop(&stream->_wd.data, 0, len);
	stream->_wd._state.done -= len;
	
	/* remaining data */
	return stream->_wd.data.len ? 1 : 0;
}